

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

void __thiscall
LZ77Compressor::compress_helper<LZ77Compressor::DefaultEncode>
          (LZ77Compressor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          Item *items,int len,DefaultEncode *encode)

{
  ulong uVar1;
  Item item;
  Item *pIVar2;
  long lVar3;
  byte local_29;
  
  uVar1 = 0;
  if (len < 1) {
    len = 0;
  }
  local_29 = 0;
  pIVar2 = items;
  for (; (uint)len != uVar1; uVar1 = uVar1 + 1) {
    local_29 = local_29 | pIVar2->isRepeat << ((byte)uVar1 & 0x1f);
    pIVar2 = pIVar2 + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(out,&local_29);
  for (lVar3 = 0; (ulong)(uint)len * 6 - lVar3 != 0; lVar3 = lVar3 + 6) {
    item.field_1.field_1.offset = *(undefined2 *)((long)&items->field_1 + lVar3 + 2);
    item._0_4_ = *(undefined4 *)(&items->isRepeat + lVar3);
    DefaultEncode::operator()(encode,out,item);
  }
  return;
}

Assistant:

void compress_helper(std::vector<uint8_t>& out, const Item* items, int len, Fn& encode) {
		uint8_t control = 0;
		for (int i = 0; i < len; i++) {
			control |= ((items[i].isRepeat ? 1 : 0) << i);
		}
		out.push_back(control);
		for (int i = 0; i < len; i++) {
			encode(out, items[i]);
		}
	}